

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

size_t __thiscall cmCTestMultiProcessHandler::GetParallelLevel(cmCTestMultiProcessHandler *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if ((this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    sVar2 = (this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value;
    sVar1 = 0x10000;
    if (sVar2 != 0) {
      sVar1 = sVar2;
    }
    return sVar1;
  }
  sVar2 = 0x10000;
  if ((this->JobServerClient).super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
      super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
      super__Optional_payload_base<cmUVJobServerClient>._M_engaged == false) {
    sVar2 = this->ParallelLevelDefault;
  }
  return sVar2;
}

Assistant:

size_t cmCTestMultiProcessHandler::GetParallelLevel() const
{
  if ((this->ParallelLevel && *this->ParallelLevel == 0) ||
      (!this->ParallelLevel && this->JobServerClient)) {
    return kParallelLevelUnbounded;
  }
  if (this->ParallelLevel) {
    return *this->ParallelLevel;
  }
  return this->ParallelLevelDefault;
}